

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O3

bool __thiscall ManifestParser::ParseEdge(ManifestParser *this,string *err)

{
  Lexer *this_00;
  pointer *pppEVar1;
  BindingEnv *pBVar2;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Edge *pEVar8;
  long *plVar9;
  Pool *pPVar10;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var11;
  Node *pNVar12;
  undefined8 *puVar13;
  _Rb_tree_header *p_Var14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  int iVar17;
  pointer ppVar18;
  ulong uVar19;
  long lVar20;
  pointer pEVar21;
  int iVar22;
  string dyndep;
  string pool_name;
  EvalString val;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  vector<EvalString,_std::allocator<EvalString>_> validations;
  uint64_t slash_bits;
  uint64_t slash_bits_3;
  undefined1 local_160 [32];
  ManifestParser *local_140;
  undefined1 local_138 [32];
  Edge *local_118;
  string *local_110;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  int local_c4;
  BindingEnv *local_c0;
  vector<EvalString,_std::allocator<EvalString>_> local_b8;
  vector<EvalString,_std::allocator<EvalString>_> local_98;
  int local_7c;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint64_t local_38;
  
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_start = (EvalString *)0x0;
  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
  super__Vector_impl_data._M_finish = (EvalString *)0x0;
  local_d8._M_allocated_capacity = 0;
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  this_00 = &(this->super_Parser).lexer_;
  local_140 = this;
  bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
  if (bVar5) {
    do {
      if (local_e8._M_allocated_capacity == local_e8._8_8_) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_e8);
        bVar5 = Lexer::PeekToken(this_00,PIPE);
        iVar22 = 0;
        if (!bVar5) goto LAB_00119c40;
        iVar22 = 0;
        goto LAB_00119bd7;
      }
      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                (&local_b8,(value_type *)&local_e8);
      uVar4 = local_e8._8_8_;
      uVar3 = local_e8._M_allocated_capacity;
      if (local_e8._8_8_ != local_e8._M_allocated_capacity) {
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_e8._M_allocated_capacity + 0x10);
        do {
          plVar9 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar15 + -1))->_M_dataplus)._M_p;
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar9) {
            operator_delete(plVar9,paVar15->_M_allocated_capacity + 1);
          }
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar15 + 0x18);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar15 + 0x28);
        } while (paVar16 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar4);
        local_e8._8_8_ = uVar3;
      }
      bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
    } while (bVar5);
  }
LAB_00119b55:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_e8);
LAB_00119b62:
  bVar5 = false;
LAB_00119b64:
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_b8);
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_98);
  return bVar5;
LAB_00119bd7:
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_d8._M_allocated_capacity = 0;
  bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)&local_e8,true,err);
  if (!bVar5) goto LAB_00119b55;
  if (local_e8._M_allocated_capacity != local_e8._8_8_) goto code_r0x00119c1b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_e8);
LAB_00119c40:
  if (local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected path","");
    bVar5 = Lexer::Error(this_00,(string *)&local_e8,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_allocated_capacity == &local_d8) goto LAB_00119b64;
LAB_0011a041:
    operator_delete((void *)local_e8._M_allocated_capacity,local_d8._M_allocated_capacity + 1);
    goto LAB_00119b64;
  }
  bVar5 = Parser::ExpectToken(&local_140->super_Parser,COLON,err);
  if (!bVar5) goto LAB_00119b62;
  local_e8._M_allocated_capacity = (size_type)&local_d8;
  local_e8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_d8._M_allocated_capacity = local_d8._M_allocated_capacity & 0xffffffffffffff00;
  local_110 = err;
  bVar5 = Lexer::ReadIdent(this_00,(string *)&local_e8);
  if (bVar5) {
    pEVar8 = (Edge *)BindingEnv::LookupRule(local_140->env_,(string *)&local_e8);
    if (pEVar8 == (Edge *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                     "unknown build rule \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8)
      ;
      plVar9 = (long *)std::__cxx11::string::append(local_160);
      pNVar12 = (Node *)(plVar9 + 2);
      if ((Node *)*plVar9 == pNVar12) {
        local_138._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
        local_138._24_8_ = plVar9[3];
        local_138._0_8_ = (Node *)(local_138 + 0x10);
      }
      else {
        local_138._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
        local_138._0_8_ = (Node *)*plVar9;
      }
      local_138._8_8_ = plVar9[1];
      *plVar9 = (long)pNVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      bVar5 = Lexer::Error(this_00,(string *)local_138,local_110);
      if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
      }
      ppVar18 = (pointer)local_160._16_8_;
      pNVar12 = (Node *)local_160._0_8_;
      if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) goto LAB_00119f04;
    }
    else {
      local_118 = pEVar8;
      while( true ) {
        local_138._0_8_ = (Node *)0x0;
        local_138._8_8_ = (Node *)0x0;
        local_138._16_8_ = (pointer)0x0;
        bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,local_110);
        if (!bVar5) break;
        if (local_138._0_8_ == local_138._8_8_) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)local_138);
          bVar5 = Lexer::PeekToken(this_00,PIPE);
          iVar17 = 0;
          if (bVar5) {
            iVar17 = 0;
            while( true ) {
              local_138._0_8_ = (Node *)0x0;
              local_138._8_8_ = (Node *)0x0;
              local_138._16_8_ = (pointer)0x0;
              bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,local_110);
              if (!bVar5) goto LAB_0011a01c;
              if (local_138._0_8_ == local_138._8_8_) break;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_98,(EvalString *)local_138);
              iVar17 = iVar17 + 1;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_138);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          }
          bVar5 = Lexer::PeekToken(this_00,PIPE2);
          local_c4 = 0;
          if (bVar5) {
            local_c4 = 0;
            while( true ) {
              local_138._0_8_ = (Node *)0x0;
              local_138._8_8_ = (Node *)0x0;
              local_138._16_8_ = (pointer)0x0;
              bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,local_110);
              if (!bVar5) goto LAB_0011a01c;
              if (local_138._0_8_ == local_138._8_8_) break;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_98,(EvalString *)local_138);
              local_c4 = local_c4 + 1;
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_138);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          }
          bVar5 = Lexer::PeekToken(this_00,PIPEAT);
          if (bVar5) {
            while( true ) {
              local_138._0_8_ = (Node *)0x0;
              local_138._8_8_ = (Node *)0x0;
              local_138._16_8_ = (pointer)0x0;
              bVar5 = Lexer::ReadEvalString(this_00,(EvalString *)local_138,true,local_110);
              if (!bVar5) goto LAB_0011a01c;
              if (local_138._0_8_ == local_138._8_8_) break;
              std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                        (&local_78,(EvalString *)local_138);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_138);
            }
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_138);
          }
          bVar5 = Parser::ExpectToken(&local_140->super_Parser,NEWLINE,local_110);
          if (bVar5) {
            bVar6 = Lexer::PeekToken(this_00,INDENT);
            local_7c = iVar17;
            if (bVar6) {
              local_c0 = (BindingEnv *)operator_new(0x70);
              pBVar2 = local_140->env_;
              (local_c0->super_Env)._vptr_Env = (_func_int **)&PTR__BindingEnv_00135a60;
              p_Var14 = &(local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var14->_M_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var14->_M_header;
              (local_c0->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              p_Var14 = &(local_c0->rules_)._M_t._M_impl.super__Rb_tree_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &p_Var14->_M_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   &p_Var14->_M_header;
              (local_c0->rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_c0->parent_ = pBVar2;
            }
            else {
              local_c0 = local_140->env_;
            }
            while (bVar6 != false) {
              local_138._0_8_ = local_138 + 0x10;
              local_138._8_8_ = (Node *)0x0;
              local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
              local_108._16_8_ = (pointer)0x0;
              local_108._0_8_ = (Node *)0x0;
              local_108._8_8_ = (pointer)0x0;
              bVar7 = ParseLet(local_140,(string *)local_138,(EvalString *)local_108,local_110);
              bVar6 = true;
              if (bVar7) {
                EvalString::Evaluate_abi_cxx11_
                          ((string *)local_160,(EvalString *)local_108,&local_140->env_->super_Env);
                BindingEnv::AddBinding(local_c0,(string *)local_138,(string *)local_160);
                if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
                  operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
                }
                bVar6 = Lexer::PeekToken(this_00,INDENT);
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_108);
              if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
              }
              bVar5 = false;
              if (!bVar7) goto LAB_0011a028;
            }
            pEVar8 = State::AddEdge((local_140->super_Parser).state_,(Rule *)local_118);
            pEVar8->env_ = local_c0;
            local_160._0_8_ = local_160 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"pool","");
            local_118 = pEVar8;
            Edge::GetBinding((string *)local_138,pEVar8,(string *)local_160);
            if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
              operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
            }
            if ((Node *)local_138._8_8_ == (Node *)0x0) {
LAB_0011a290:
              std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                        ((vector<Node_*,_std::allocator<Node_*>_> *)&local_118->outputs_,
                         ((long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
              if ((long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl
                        .super__Vector_impl_data._M_start == 0) {
                bVar5 = false;
              }
              else {
                uVar19 = ((long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_b8.super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555;
                lVar20 = 0;
                bVar5 = false;
                do {
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)local_160,
                             (EvalString *)
                             ((long)&((local_b8.
                                       super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->parsed_).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar20),
                             &local_c0->super_Env);
                  if (local_160._8_8_ == 0) {
                    local_108._0_8_ = local_108 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_108,"empty path","");
                    bVar5 = Lexer::Error(this_00,(string *)local_108,local_110);
                    if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
                      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                    }
                    bVar6 = false;
                  }
                  else {
                    CanonicalizePath((string *)local_160,(uint64_t *)&local_58);
                    path.len_ = local_160._8_8_;
                    path.str_ = (char *)local_160._0_8_;
                    bVar7 = State::AddOut((local_140->super_Parser).state_,local_118,path,
                                          (uint64_t)local_58._M_dataplus._M_p);
                    bVar6 = true;
                    if (!bVar7) {
                      if (*(int *)&local_140->options_ == 1) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_108,"multiple rules generate ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_160);
                        Lexer::Error(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_108,local_110);
                        if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
                          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                        }
                        bVar6 = false;
                        bVar5 = false;
                      }
                      else {
                        if (local_140->quiet_ == false) {
                          Warning("multiple rules generate %s. builds involving this target will not be correct; continuing anyway"
                                  ,local_160._0_8_);
                        }
                        iVar22 = iVar22 + -1 + (uint)((ulong)(long)iVar22 < uVar19);
                      }
                    }
                  }
                  if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
                    operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
                  }
                  if (!bVar6) goto LAB_0011a985;
                  lVar20 = lVar20 + 0x18;
                  uVar19 = uVar19 - 1;
                } while (uVar19 != 0);
              }
              pEVar8 = local_118;
              if ((local_118->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (local_118->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pppEVar1 = &(((local_140->super_Parser).state_)->edges_).
                            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppEVar1 = *pppEVar1 + -1;
                Edge::~Edge(local_118);
                operator_delete(pEVar8,0x88);
                bVar5 = true;
              }
              else {
                local_118->implicit_outs_ = iVar22;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          (&local_118->inputs_,
                           ((long)local_98.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_98.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
                if (local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pEVar21 = local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    EvalString::Evaluate_abi_cxx11_
                              ((string *)local_160,pEVar21,&local_c0->super_Env);
                    uVar3 = local_160._8_8_;
                    if (local_160._8_8_ == 0) {
                      local_108._0_8_ = local_108 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_108,"empty path","");
                      bVar5 = Lexer::Error(this_00,(string *)local_108,local_110);
                      if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
                        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                      }
                    }
                    else {
                      CanonicalizePath((string *)local_160,(uint64_t *)local_108);
                      path_00.len_ = local_160._8_8_;
                      path_00.str_ = (char *)local_160._0_8_;
                      State::AddIn((local_140->super_Parser).state_,local_118,path_00,
                                   local_108._0_8_);
                    }
                    if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
                      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
                    }
                    if (uVar3 == 0) goto LAB_0011a985;
                    pEVar21 = pEVar21 + 1;
                  } while (pEVar21 !=
                           local_98.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
                }
                local_118->implicit_deps_ = local_7c;
                local_118->order_only_deps_ = local_c4;
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          (&local_118->validations_,
                           ((long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
                if (local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  pEVar21 = local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    EvalString::Evaluate_abi_cxx11_
                              ((string *)local_160,pEVar21,&local_c0->super_Env);
                    uVar3 = local_160._8_8_;
                    if (local_160._8_8_ == 0) {
                      local_108._0_8_ = local_108 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_108,"empty path","");
                      bVar5 = Lexer::Error(this_00,(string *)local_108,local_110);
                      if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
                        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                      }
                    }
                    else {
                      CanonicalizePath((string *)local_160,(uint64_t *)local_108);
                      path_01.len_ = local_160._8_8_;
                      path_01.str_ = (char *)local_160._0_8_;
                      State::AddValidation
                                ((local_140->super_Parser).state_,local_118,path_01,local_108._0_8_)
                      ;
                    }
                    if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
                      operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
                    }
                    if (uVar3 == 0) goto LAB_0011a985;
                    pEVar21 = pEVar21 + 1;
                  } while (pEVar21 !=
                           local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
                }
                if ((*(int *)&local_140->field_0x54 == 0) &&
                   (bVar5 = Edge::maybe_phonycycle_diagnostic(local_118), bVar5)) {
                  local_160._0_8_ =
                       *(local_118->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
                  _Var11 = std::
                           __remove_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                     ((__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       )(local_118->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                      (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       )(local_118->inputs_).
                                        super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish,
                                      (_Iter_equals_val<Node_*const>)local_160);
                  if ((_Var11._M_current !=
                       (local_118->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish) &&
                     ((local_118->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish = _Var11._M_current,
                     local_140->quiet_ == false)) {
                    Warning("phony target \'%s\' names itself as an input; ignoring [-w phonycycle=warn]"
                            ,*(undefined8 *)local_160._0_8_);
                  }
                }
                Edge::GetUnescapedDyndep_abi_cxx11_((string *)local_160,local_118);
                bVar5 = true;
                if (local_160._8_8_ != 0) {
                  CanonicalizePath((string *)local_160,&local_38);
                  path_02.len_ = local_160._8_8_;
                  path_02.str_ = (char *)local_160._0_8_;
                  pNVar12 = State::GetNode((local_140->super_Parser).state_,path_02,local_38);
                  pEVar8 = local_118;
                  local_118->dyndep_ = pNVar12;
                  pNVar12->dyndep_pending_ = true;
                  _Var11 = std::
                           __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)&local_118->inputs_)->_M_allocated_capacity,
                                      *(undefined8 *)((long)&local_118->inputs_ + 8),
                                      &local_118->dyndep_);
                  if (_Var11._M_current == *(Node ***)((long)&pEVar8->inputs_ + 8)) {
                    std::operator+(&local_58,"dyndep \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_160);
                    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
                    pNVar12 = (Node *)(puVar13 + 2);
                    if ((Node *)*puVar13 == pNVar12) {
                      local_108._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
                      local_108._24_8_ = puVar13[3];
                      local_108._0_8_ = (Node *)(local_108 + 0x10);
                    }
                    else {
                      local_108._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
                      local_108._0_8_ = (Node *)*puVar13;
                    }
                    local_108._8_8_ = puVar13[1];
                    *puVar13 = pNVar12;
                    puVar13[1] = 0;
                    *(undefined1 *)(puVar13 + 2) = 0;
                    bVar5 = Lexer::Error(this_00,(string *)local_108,local_110);
                    if ((Node *)local_108._0_8_ != (Node *)(local_108 + 0x10)) {
                      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_58._M_dataplus._M_p != &local_58.field_2) {
                      operator_delete(local_58._M_dataplus._M_p,
                                      local_58.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                ppVar18 = (pointer)local_160._16_8_;
                pNVar12 = (Node *)local_160._0_8_;
                if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) goto LAB_0011a97d;
              }
            }
            else {
              pPVar10 = State::LookupPool((local_140->super_Parser).state_,(string *)local_138);
              if (pPVar10 != (Pool *)0x0) {
                local_118->pool_ = pPVar10;
                goto LAB_0011a290;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,"unknown pool name \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138);
              puVar13 = (undefined8 *)std::__cxx11::string::append(local_108);
              local_160._0_8_ = local_160 + 0x10;
              pNVar12 = (Node *)(puVar13 + 2);
              if ((Node *)*puVar13 == pNVar12) {
                local_160._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
                local_160._24_8_ = puVar13[3];
              }
              else {
                local_160._16_8_ = (pNVar12->path_)._M_dataplus._M_p;
                local_160._0_8_ = (Node *)*puVar13;
              }
              local_160._8_8_ = puVar13[1];
              *puVar13 = pNVar12;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              bVar5 = Lexer::Error(this_00,(string *)local_160,local_110);
              if ((Node *)local_160._0_8_ != (Node *)(local_160 + 0x10)) {
                operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
              }
              ppVar18 = (pointer)local_108._16_8_;
              pNVar12 = (Node *)local_108._0_8_;
              if ((Node *)local_108._0_8_ == (Node *)(local_108 + 0x10)) goto LAB_0011a985;
LAB_0011a97d:
              operator_delete(pNVar12,(ulong)((long)&(ppVar18->first)._M_dataplus._M_p + 1));
            }
LAB_0011a985:
            ppVar18 = (pointer)local_138._16_8_;
            pNVar12 = (Node *)local_138._0_8_;
            if ((Node *)local_138._0_8_ != (Node *)(local_138 + 0x10)) goto LAB_00119f04;
            goto LAB_0011a028;
          }
          goto LAB_0011a026;
        }
        std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                  (&local_98,(EvalString *)local_138);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)local_138);
      }
LAB_0011a01c:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                 *)local_138);
LAB_0011a026:
      bVar5 = false;
    }
  }
  else {
    local_138._0_8_ = (Node *)(local_138 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"expected build command name","");
    bVar5 = Lexer::Error(this_00,(string *)local_138,local_110);
    ppVar18 = (pointer)local_138._16_8_;
    pNVar12 = (Node *)local_138._0_8_;
    if ((Node *)local_138._0_8_ == (Node *)(local_138 + 0x10)) goto LAB_0011a028;
LAB_00119f04:
    operator_delete(pNVar12,(ulong)((long)&(ppVar18->first)._M_dataplus._M_p + 1));
  }
LAB_0011a028:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_allocated_capacity == &local_d8) goto LAB_00119b64;
  goto LAB_0011a041;
code_r0x00119c1b:
  std::vector<EvalString,_std::allocator<EvalString>_>::push_back(&local_b8,(value_type *)&local_e8)
  ;
  iVar22 = iVar22 + 1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)&local_e8);
  goto LAB_00119bd7;
}

Assistant:

bool ManifestParser::ParseEdge(string* err) {
  vector<EvalString> ins, outs, validations;

  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    while (!out.empty()) {
      outs.push_back(out);

      out.Clear();
      if (!lexer_.ReadPath(&out, err))
        return false;
    }
  }

  // Add all implicit outs, counting how many as we go.
  int implicit_outs = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return false;
      if (out.empty())
        break;
      outs.push_back(out);
      ++implicit_outs;
    }
  }

  if (outs.empty())
    return lexer_.Error("expected path", err);

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name))
    return lexer_.Error("expected build command name", err);

  const Rule* rule = env_->LookupRule(rule_name);
  if (!rule)
    return lexer_.Error("unknown build rule '" + rule_name + "'", err);

  for (;;) {
    // XXX should we require one path here?
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (in.empty())
      break;
    ins.push_back(in);
  }

  // Add all implicit deps, counting how many as we go.
  int implicit = 0;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++implicit;
    }
  }

  // Add all order-only deps, counting how many as we go.
  int order_only = 0;
  if (lexer_.PeekToken(Lexer::PIPE2)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return false;
      if (in.empty())
        break;
      ins.push_back(in);
      ++order_only;
    }
  }

  // Add all validations, counting how many as we go.
  if (lexer_.PeekToken(Lexer::PIPEAT)) {
    for (;;) {
      EvalString validation;
      if (!lexer_.ReadPath(&validation, err))
        return false;
      if (validation.empty())
        break;
      validations.push_back(validation);
    }
  }

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  // Bindings on edges are rare, so allocate per-edge envs only when needed.
  bool has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  BindingEnv* env = has_indent_token ? new BindingEnv(env_) : env_;
  while (has_indent_token) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;

    env->AddBinding(key, val.Evaluate(env_));
    has_indent_token = lexer_.PeekToken(Lexer::INDENT);
  }

  Edge* edge = state_->AddEdge(rule);
  edge->env_ = env;

  string pool_name = edge->GetBinding("pool");
  if (!pool_name.empty()) {
    Pool* pool = state_->LookupPool(pool_name);
    if (pool == NULL)
      return lexer_.Error("unknown pool name '" + pool_name + "'", err);
    edge->pool_ = pool;
  }

  edge->outputs_.reserve(outs.size());
  for (size_t i = 0, e = outs.size(); i != e; ++i) {
    string path = outs[i].Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    if (!state_->AddOut(edge, path, slash_bits)) {
      if (options_.dupe_edge_action_ == kDupeEdgeActionError) {
        lexer_.Error("multiple rules generate " + path, err);
        return false;
      } else {
        if (!quiet_) {
          Warning(
              "multiple rules generate %s. builds involving this target will "
              "not be correct; continuing anyway",
              path.c_str());
        }
        if (e - i <= static_cast<size_t>(implicit_outs))
          --implicit_outs;
      }
    }
  }

  if (edge->outputs_.empty()) {
    // All outputs of the edge are already created by other edges. Don't add
    // this edge.  Do this check before input nodes are connected to the edge.
    state_->edges_.pop_back();
    delete edge;
    return true;
  }
  edge->implicit_outs_ = implicit_outs;

  edge->inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddIn(edge, path, slash_bits);
  }
  edge->implicit_deps_ = implicit;
  edge->order_only_deps_ = order_only;

  edge->validations_.reserve(validations.size());
  for (std::vector<EvalString>::iterator v = validations.begin();
      v != validations.end(); ++v) {
    string path = v->Evaluate(env);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    state_->AddValidation(edge, path, slash_bits);
  }

  if (options_.phony_cycle_action_ == kPhonyCycleActionWarn &&
      edge->maybe_phonycycle_diagnostic()) {
    // CMake 2.8.12.x and 3.0.x incorrectly write phony build statements
    // that reference themselves.  Ninja used to tolerate these in the
    // build graph but that has since been fixed.  Filter them out to
    // support users of those old CMake versions.
    Node* out = edge->outputs_[0];
    vector<Node*>::iterator new_end =
        remove(edge->inputs_.begin(), edge->inputs_.end(), out);
    if (new_end != edge->inputs_.end()) {
      edge->inputs_.erase(new_end, edge->inputs_.end());
      if (!quiet_) {
        Warning("phony target '%s' names itself as an input; "
                "ignoring [-w phonycycle=warn]",
                out->path().c_str());
      }
    }
  }

  // Lookup, validate, and save any dyndep binding.  It will be used later
  // to load generated dependency information dynamically, but it must
  // be one of our manifest-specified inputs.
  string dyndep = edge->GetUnescapedDyndep();
  if (!dyndep.empty()) {
    uint64_t slash_bits;
    CanonicalizePath(&dyndep, &slash_bits);
    edge->dyndep_ = state_->GetNode(dyndep, slash_bits);
    edge->dyndep_->set_dyndep_pending(true);
    vector<Node*>::iterator dgi =
      std::find(edge->inputs_.begin(), edge->inputs_.end(), edge->dyndep_);
    if (dgi == edge->inputs_.end()) {
      return lexer_.Error("dyndep '" + dyndep + "' is not an input", err);
    }
  }

  return true;
}